

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void __thiscall
pbrt::detail::DispatchSplit<9>::operator()
          (void *param_1,
          TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          *param_2,int param_3)

{
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  int mid;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  DispatchSplit<5> local_4a [2];
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  DispatchSplit<4> local_21;
  undefined4 local_20;
  int local_1c;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *local_18;
  void *local_10;
  
  local_20 = 4;
  local_1c = param_3;
  local_18 = param_2;
  local_10 = param_1;
  if (param_3 + -1 < 4) {
    local_40 = in_stack_00000008;
    local_38 = in_stack_00000010;
    local_30 = in_stack_00000018;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_48,param_2);
    DispatchSplit<4>::operator()(&local_21,&local_48,local_1c);
  }
  else {
    local_68 = in_stack_00000008;
    local_60 = in_stack_00000010;
    local_58 = in_stack_00000018;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_70,param_2);
    DispatchSplit<5>::operator()(local_4a,&local_70,local_1c + -4);
  }
  return;
}

Assistant:

PBRT_CPU_GPU inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplit<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplit<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }